

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof.cpp
# Opt level: O0

int32_t uspoof_check2UTF8_63
                  (USpoofChecker *sc,char *id,int32_t length,USpoofCheckResult *checkResult,
                  UErrorCode *status)

{
  UBool UVar1;
  size_t sVar2;
  USpoofCheckResult *pUVar3;
  StringPiece utf8;
  int32_t local_ac;
  undefined1 auStack_88 [4];
  int32_t result;
  uint local_80;
  undefined1 local_78 [8];
  UnicodeString idStr;
  UErrorCode *status_local;
  USpoofCheckResult *checkResult_local;
  int32_t length_local;
  char *id_local;
  USpoofChecker *sc_local;
  
  pUVar3 = checkResult;
  idStr.fUnion._48_8_ = status;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    local_ac = length;
    if (length < 0) {
      sVar2 = strlen(id);
      local_ac = (int32_t)sVar2;
    }
    icu_63::StringPiece::StringPiece((StringPiece *)auStack_88,id,local_ac);
    utf8.ptr_ = (char *)(ulong)local_80;
    utf8._8_8_ = pUVar3;
    icu_63::UnicodeString::fromUTF8((UnicodeString *)local_78,_auStack_88,utf8);
    sc_local._4_4_ =
         uspoof_check2UnicodeString_63
                   (sc,(UnicodeString *)local_78,checkResult,(UErrorCode *)idStr.fUnion._48_8_);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
  }
  else {
    sc_local._4_4_ = 0;
  }
  return sc_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uspoof_check2UTF8(const USpoofChecker *sc,
    const char *id, int32_t length,
    USpoofCheckResult* checkResult,
    UErrorCode *status) {

    if (U_FAILURE(*status)) {
        return 0;
    }
    UnicodeString idStr = UnicodeString::fromUTF8(StringPiece(id, length>=0 ? length : static_cast<int32_t>(uprv_strlen(id))));
    int32_t result = uspoof_check2UnicodeString(sc, idStr, checkResult, status);
    return result;
}